

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void google::protobuf::internal::MapMergeFrom<int,float>(Map<int,_float> *dest,Map<int,_float> *src)

{
  float fVar1;
  bool bVar2;
  reference key;
  float *pfVar3;
  value_type *elem;
  const_iterator __end0;
  const_iterator __begin0;
  Map<int,_float> *__range3;
  Map<int,_float> *src_local;
  Map<int,_float> *dest_local;
  
  Map<int,_float>::begin((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,src);
  Map<int,_float>::end((const_iterator *)&elem,src);
  while( true ) {
    bVar2 = protobuf::operator!=
                      ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)&elem);
    if (!bVar2) break;
    key = Map<int,_float>::const_iterator::operator*
                    ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
    fVar1 = key->second;
    pfVar3 = Map<int,_float>::operator[]<int>(dest,&key->first);
    *pfVar3 = fVar1;
    Map<int,_float>::const_iterator::operator++
              ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}